

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::AddVarLinkEntries(cmComputeLinkDepends *this,int depender_index,char *value)

{
  bool bVar1;
  bool bVar2;
  reference __lhs;
  ulong uVar3;
  string *psVar4;
  undefined1 local_1a0 [8];
  cmLinkItem item;
  cmValue local_120;
  cmValue val;
  cmAlphaNum local_e8;
  undefined1 local_b8 [8];
  string var;
  string *d;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_60 [3];
  bool haveLLT;
  cmTargetLinkLibraryType llt;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> actual_libs;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  char *value_local;
  int depender_index_local;
  cmComputeLinkDepends *this_local;
  
  deplist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)value;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &actual_libs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,value);
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,stack0xffffffffffffffb8,false);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::vector
            ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_60);
  __range1._4_4_ = GENERAL_LibraryType;
  bVar2 = false;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
  d = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&d), bVar1) {
    __lhs = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    bVar1 = std::operator==(__lhs,"debug");
    if (bVar1) {
      __range1._4_4_ = DEBUG_LibraryType;
      bVar2 = true;
    }
    else {
      bVar1 = std::operator==(__lhs,"optimized");
      if (bVar1) {
        __range1._4_4_ = OPTIMIZED_LibraryType;
        bVar2 = true;
      }
      else {
        bVar1 = std::operator==(__lhs,"general");
        if (bVar1) {
          __range1._4_4_ = GENERAL_LibraryType;
          bVar2 = true;
        }
        else {
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            if (!bVar2) {
              cmAlphaNum::cmAlphaNum(&local_e8,__lhs);
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)&val,"_LINK_TYPE");
              cmStrCat<>((string *)local_b8,&local_e8,(cmAlphaNum *)&val);
              local_120 = cmMakefile::GetDefinition(this->Makefile,(string *)local_b8);
              bVar2 = cmValue::operator_cast_to_bool(&local_120);
              if (bVar2) {
                psVar4 = cmValue::operator*[abi_cxx11_(&local_120);
                bVar2 = std::operator==(psVar4,"debug");
                if (bVar2) {
                  __range1._4_4_ = DEBUG_LibraryType;
                }
                else {
                  psVar4 = cmValue::operator*[abi_cxx11_(&local_120);
                  bVar2 = std::operator==(psVar4,"optimized");
                  if (bVar2) {
                    __range1._4_4_ = OPTIMIZED_LibraryType;
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_b8);
            }
            if ((__range1._4_4_ == GENERAL_LibraryType) || (__range1._4_4_ == this->LinkType)) {
              ResolveLinkItem((cmLinkItem *)
                              &item.Backtrace.
                               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,this,depender_index,__lhs);
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                        ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_60,
                         (cmLinkItem *)
                         &item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                          TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              cmLinkItem::~cmLinkItem
                        ((cmLinkItem *)
                         &item.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                          TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
            }
            else if ((this->OldLinkDirMode & 1U) != 0) {
              ResolveLinkItem((cmLinkItem *)local_1a0,this,depender_index,__lhs);
              CheckWrongConfigItem(this,(cmLinkItem *)local_1a0);
              cmLinkItem::~cmLinkItem((cmLinkItem *)local_1a0);
            }
            __range1._4_4_ = GENERAL_LibraryType;
            bVar2 = false;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  AddLinkEntries<cmLinkItem>
            (this,depender_index,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_60);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector
            ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void cmComputeLinkDepends::AddVarLinkEntries(int depender_index,
                                             const char* value)
{
  // This is called to add the dependencies named by
  // <item>_LIB_DEPENDS.  The variable contains a semicolon-separated
  // list.  The list contains link-type;item pairs and just items.
  std::vector<std::string> deplist = cmExpandedList(value);

  // Look for entries meant for this configuration.
  std::vector<cmLinkItem> actual_libs;
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;
  for (std::string const& d : deplist) {
    if (d == "debug") {
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (d == "optimized") {
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (d == "general") {
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (!d.empty()) {
      // If no explicit link type was given prior to this entry then
      // check if the entry has its own link type variable.  This is
      // needed for compatibility with dependency files generated by
      // the export_library_dependencies command from CMake 2.4 and
      // lower.
      if (!haveLLT) {
        std::string var = cmStrCat(d, "_LINK_TYPE");
        if (cmValue val = this->Makefile->GetDefinition(var)) {
          if (*val == "debug") {
            llt = DEBUG_LibraryType;
          } else if (*val == "optimized") {
            llt = OPTIMIZED_LibraryType;
          }
        }
      }

      // If the library is meant for this link type then use it.
      if (llt == GENERAL_LibraryType || llt == this->LinkType) {
        actual_libs.emplace_back(this->ResolveLinkItem(depender_index, d));
      } else if (this->OldLinkDirMode) {
        cmLinkItem item = this->ResolveLinkItem(depender_index, d);
        this->CheckWrongConfigItem(item);
      }

      // Reset the link type until another explicit type is given.
      llt = GENERAL_LibraryType;
      haveLLT = false;
    }
  }

  // Add the entries from this list.
  this->AddLinkEntries(depender_index, actual_libs);
}